

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O0

int IDABBDPrecInit(void *ida_mem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,sunrealtype dq_rel_yy,IDABBDLocalFn Gres,
                  IDABBDCommFn Gcomm)

{
  int iVar1;
  SUNContext_conflict sunctx;
  SUNMatrix p_Var2;
  N_Vector p_Var3;
  long lVar4;
  SUNLinearSolver p_Var5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  IDAMem in_RDI;
  sunindextype in_R8;
  SUNContext_conflict in_R9;
  double in_XMM0_Qa;
  long in_stack_00000008;
  long in_stack_00000010;
  int flag;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype storage_mu;
  sunindextype mlk;
  sunindextype muk;
  IBBDPrecData pdata;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  double local_130;
  SUNContext_conflict in_stack_fffffffffffffed8;
  SUNContext_conflict in_stack_fffffffffffffee8;
  SUNContext_conflict sunctx_00;
  SUNContext_conflict ida_mem_00;
  sunindextype in_stack_ffffffffffffff08;
  long local_e8;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  SUNContext_conflict local_70;
  SUNContext_conflict local_68;
  sunindextype local_60;
  long *local_58;
  void *pvVar6;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-1,0x47,"IDABBDPrecInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->ida_lmem == (void *)0x0) {
    IDAProcessError(in_RDI,-2,0x50,"IDABBDPrecInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                    ,
                    "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                   );
    local_4 = -2;
  }
  else {
    pvVar6 = in_RDI->ida_lmem;
    if (in_RDI->ida_tempv1->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0) {
      IDAProcessError(in_RDI,-3,0x59,"IDABBDPrecInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      local_58 = (long *)0x0;
      local_58 = (long *)malloc(0xa0);
      if (local_58 == (long *)0x0) {
        IDAProcessError(in_RDI,-4,99,"IDABBDPrecInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                        ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        local_58[0x13] = (long)in_RDI;
        local_58[5] = in_stack_00000008;
        local_58[6] = in_stack_00000010;
        local_a8 = in_RDX;
        if (in_RDX < 0) {
          local_a8 = 0;
        }
        if (in_RSI + -1 < local_a8) {
          local_b0 = in_RSI + -1;
        }
        else {
          local_b8 = in_RDX;
          if (in_RDX < 0) {
            local_b8 = 0;
          }
          local_b0 = local_b8;
        }
        *local_58 = local_b0;
        local_c8 = in_RCX;
        if (in_RCX < 0) {
          local_c8 = 0;
        }
        if (in_RSI + -1 < local_c8) {
          local_d0 = in_RSI + -1;
        }
        else {
          local_d8 = in_RCX;
          if (in_RCX < 0) {
            local_d8 = 0;
          }
          local_d0 = local_d8;
        }
        local_58[1] = local_d0;
        local_e8 = in_R8;
        if (in_R8 < 0) {
          local_e8 = 0;
        }
        if (in_RSI + -1 < local_e8) {
          in_R8 = in_stack_ffffffffffffff08;
          local_60 = in_RSI + -1;
        }
        else {
          local_60 = in_R8;
          if (in_R8 < 0) {
            in_R8 = 0;
            local_60 = in_R8;
          }
        }
        ida_mem_00 = in_R9;
        if ((long)in_R9 < 0) {
          ida_mem_00 = (SUNContext_conflict)0x0;
        }
        if (in_RSI + -1 < (long)ida_mem_00) {
          in_R9 = in_stack_fffffffffffffee8;
          sunctx_00 = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          sunctx_00 = in_R9;
          if ((long)in_R9 < 0) {
            in_R9 = (SUNContext_conflict)0x0;
            sunctx_00 = in_R9;
          }
        }
        local_58[2] = local_60;
        local_58[3] = (long)sunctx_00;
        if (in_RSI + -1 < (long)&sunctx_00->profiler + local_60) {
          sunctx = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          sunctx = (SUNContext_conflict)((long)&sunctx_00->profiler + local_60);
        }
        local_58[8] = 0;
        local_70 = sunctx;
        local_68 = sunctx_00;
        p_Var2 = SUNBandMatrixStorage(local_60,in_R8,in_RSI + -1,(sunindextype)ida_mem_00,sunctx_00)
        ;
        local_58[8] = (long)p_Var2;
        if (local_58[8] == 0) {
          free(local_58);
          local_58 = (long *)0x0;
          IDAProcessError(in_RDI,-4,0x7e,"IDABBDPrecInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                          ,"A memory request failed.");
          local_4 = -4;
        }
        else {
          local_58[10] = 0;
          p_Var3 = N_VNewEmpty_Serial((sunindextype)sunctx,in_stack_fffffffffffffed8);
          local_58[10] = (long)p_Var3;
          if (local_58[10] == 0) {
            SUNMatDestroy(local_58[8]);
            free(local_58);
            local_58 = (long *)0x0;
            IDAProcessError(in_RDI,-4,0x8b,"IDABBDPrecInit",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                            ,"A memory request failed.");
            local_4 = -4;
          }
          else {
            local_58[0xb] = 0;
            p_Var3 = N_VNewEmpty_Serial((sunindextype)sunctx,in_stack_fffffffffffffed8);
            local_58[0xb] = (long)p_Var3;
            if (local_58[0xb] == 0) {
              N_VDestroy(local_58[10]);
              SUNMatDestroy(local_58[8]);
              free(local_58);
              local_58 = (long *)0x0;
              IDAProcessError(in_RDI,-4,0x97,"IDABBDPrecInit",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                              ,"A memory request failed.");
              local_4 = -4;
            }
            else {
              local_58[0xc] = 0;
              lVar4 = N_VClone(in_RDI->ida_tempv1);
              local_58[0xc] = lVar4;
              if (local_58[0xc] == 0) {
                N_VDestroy(local_58[0xb]);
                N_VDestroy(local_58[10]);
                SUNMatDestroy(local_58[8]);
                free(local_58);
                local_58 = (long *)0x0;
                IDAProcessError(in_RDI,-4,0xa4,"IDABBDPrecInit",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                                ,"A memory request failed.");
                local_4 = -4;
              }
              else {
                local_58[0xd] = 0;
                lVar4 = N_VClone(in_RDI->ida_tempv1);
                local_58[0xd] = lVar4;
                if (local_58[0xd] == 0) {
                  N_VDestroy(local_58[0xb]);
                  N_VDestroy(local_58[10]);
                  N_VDestroy(local_58[0xc]);
                  SUNMatDestroy(local_58[8]);
                  free(local_58);
                  local_58 = (long *)0x0;
                  IDAProcessError(in_RDI,-4,0xb2,"IDABBDPrecInit",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                                  ,"A memory request failed.");
                  local_4 = -4;
                }
                else {
                  local_58[0xe] = 0;
                  lVar4 = N_VClone(in_RDI->ida_tempv1);
                  local_58[0xe] = lVar4;
                  if (local_58[0xe] == 0) {
                    N_VDestroy(local_58[0xb]);
                    N_VDestroy(local_58[10]);
                    N_VDestroy(local_58[0xc]);
                    N_VDestroy(local_58[0xd]);
                    SUNMatDestroy(local_58[8]);
                    free(local_58);
                    local_58 = (long *)0x0;
                    IDAProcessError(in_RDI,-4,0xc1,"IDABBDPrecInit",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                                    ,"A memory request failed.");
                    local_4 = -4;
                  }
                  else {
                    local_58[0xf] = 0;
                    lVar4 = N_VClone(in_RDI->ida_tempv1);
                    local_58[0xf] = lVar4;
                    if (local_58[0xf] == 0) {
                      N_VDestroy(local_58[0xb]);
                      N_VDestroy(local_58[10]);
                      N_VDestroy(local_58[0xc]);
                      N_VDestroy(local_58[0xd]);
                      N_VDestroy(local_58[0xe]);
                      SUNMatDestroy(local_58[8]);
                      free(local_58);
                      local_58 = (long *)0x0;
                      IDAProcessError(in_RDI,-4,0xd1,"IDABBDPrecInit",
                                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                                      ,"A memory request failed.");
                      local_4 = -4;
                    }
                    else {
                      local_58[9] = 0;
                      p_Var5 = SUNLinSol_Band((N_Vector)sunctx_00,(SUNMatrix)in_R9,sunctx);
                      local_58[9] = (long)p_Var5;
                      if (local_58[9] == 0) {
                        N_VDestroy(local_58[10]);
                        N_VDestroy(local_58[0xb]);
                        N_VDestroy(local_58[0xc]);
                        N_VDestroy(local_58[0xd]);
                        N_VDestroy(local_58[0xe]);
                        N_VDestroy(local_58[0xf]);
                        SUNMatDestroy(local_58[8]);
                        free(local_58);
                        local_58 = (long *)0x0;
                        IDAProcessError(in_RDI,-4,0xe4,"IDABBDPrecInit",
                                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                                        ,"A memory request failed.");
                        local_4 = -4;
                      }
                      else {
                        local_130 = in_XMM0_Qa;
                        iVar1 = SUNLinSolInitialize(local_58[9]);
                        if (iVar1 == 0) {
                          if (local_130 <= 0.0) {
                            if (0.0 < in_RDI->ida_uround) {
                              local_130 = sqrt(in_RDI->ida_uround);
                            }
                            else {
                              local_130 = 0.0;
                            }
                          }
                          local_58[4] = (long)local_130;
                          local_58[7] = in_RSI;
                          local_58[0x10] = 0;
                          local_58[0x11] = 0;
                          if (in_RDI->ida_tempv1->ops->nvspace !=
                              (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                            N_VSpace(in_RDI->ida_tempv1,&local_78,&local_80);
                            local_58[0x10] = local_78 * 4 + local_58[0x10];
                            local_58[0x11] = local_80 * 4 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[0xb] + 8) + 0x20) != 0) {
                            N_VSpace(local_58[0xb],&local_78,&local_80);
                            local_58[0x10] = local_78 * 2 + local_58[0x10];
                            local_58[0x11] = local_80 * 2 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[8] + 8) + 0x50) != 0) {
                            SUNMatSpace(local_58[8],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[9] + 8) + 0x60) != 0) {
                            SUNLinSolSpace(local_58[9],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          local_58[0x12] = 0;
                          if (*(long *)((long)pvVar6 + 0x110) != 0) {
                            (**(code **)((long)pvVar6 + 0x110))(in_RDI);
                          }
                          *(long **)((long)pvVar6 + 0x118) = local_58;
                          *(code **)((long)pvVar6 + 0x110) = IDABBDPrecFree;
                          local_4 = IDASetPreconditioner
                                              (ida_mem_00,(IDALsPrecSetupFn)sunctx_00,
                                               (IDALsPrecSolveFn)in_R9);
                        }
                        else {
                          N_VDestroy(local_58[10]);
                          N_VDestroy(local_58[0xb]);
                          N_VDestroy(local_58[0xc]);
                          N_VDestroy(local_58[0xd]);
                          N_VDestroy(local_58[0xe]);
                          N_VDestroy(local_58[0xf]);
                          SUNMatDestroy(local_58[8]);
                          SUNLinSolFree(local_58[9]);
                          free(local_58);
                          local_58 = (long *)0x0;
                          IDAProcessError(in_RDI,-9,0xf7,"IDABBDPrecInit",
                                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                                          ,"An error arose from a SUNBandLinearSolver routine.");
                          local_4 = -9;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int IDABBDPrecInit(void* ida_mem, sunindextype Nlocal, sunindextype mudq,
                   sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                   sunrealtype dq_rel_yy, IDABBDLocalFn Gres, IDABBDCommFn Gcomm)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Test if the LS linear solver interface has been created */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  if (IDA_mem->ida_tempv1->ops->nvgetarraypointer == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGBBD_BAD_NVECTOR);
    return (IDALS_ILL_INPUT);
  }

  /* Allocate data memory. */
  pdata = NULL;
  pdata = (IBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* Set pointers to glocal and gcomm; load half-bandwidths. */
  pdata->ida_mem = IDA_mem;
  pdata->glocal  = Gres;
  pdata->gcomm   = Gcomm;
  pdata->mudq    = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq    = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk            = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk            = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep  = muk;
  pdata->mlkeep  = mlk;

  /* Set extended upper half-bandwidth for PP (required for pivoting). */
  storage_mu = SUNMIN(Nlocal - 1, muk + mlk);

  /* Allocate memory for preconditioner matrix. */
  pdata->PP = NULL;
  pdata->PP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                   IDA_mem->ida_sunctx);
  if (pdata->PP == NULL)
  {
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNewEmpty_Serial(Nlocal, IDA_mem->ida_sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, IDA_mem->ida_sunctx);
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv1 = NULL;
  pdata->tempv1 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv1 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv2 = NULL;
  pdata->tempv2 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv2 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->tempv1);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv3 = NULL;
  pdata->tempv3 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv3 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv4 = NULL;
  pdata->tempv4 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv4 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->rlocal, pdata->PP, IDA_mem->ida_sunctx);
  if (pdata->LS == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    N_VDestroy(pdata->tempv4);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    N_VDestroy(pdata->tempv4);
    SUNMatDestroy(pdata->PP);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNLS_FAIL);
    return (IDALS_SUNLS_FAIL);
  }

  /* Set rel_yy based on input value dq_rel_yy (0 implies default). */
  pdata->rel_yy = (dq_rel_yy > ZERO) ? dq_rel_yy : SUNRsqrt(IDA_mem->ida_uround);

  /* Store Nlocal to be used in IDABBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge. */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (IDA_mem->ida_tempv1->ops->nvspace)
  {
    N_VSpace(IDA_mem->ida_tempv1, &lrw1, &liw1);
    pdata->rpwsize += 4 * lrw1;
    pdata->ipwsize += 4 * liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += 2 * lrw1;
    pdata->ipwsize += 2 * liw1;
  }
  if (pdata->PP->ops->space)
  {
    flag = SUNMatSpace(pdata->PP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure pdata is free from any previous allocations */
  if (idals_mem->pfree) { idals_mem->pfree(IDA_mem); }

  /* Point to the new pdata field in the LS memory */
  idals_mem->pdata = pdata;

  /* Attach the pfree function */
  idals_mem->pfree = IDABBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = IDASetPreconditioner(ida_mem, IDABBDPrecSetup, IDABBDPrecSolve);

  return (flag);
}